

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_java_struct
          (t_javame_generator *this,t_struct *tstruct,bool is_exception)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  ostream *poVar3;
  int __oflag;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  undefined1 local_230 [8];
  ofstream_with_content_based_conditional_update f_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string f_struct_name;
  bool is_exception_local;
  t_struct *tstruct_local;
  t_javame_generator *this_local;
  
  f_struct_name.field_2._M_local_buf[0xf] = is_exception;
  std::operator+(&local_80,&this->package_dir_,"/");
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+(&local_60,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,".java");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,pcVar2,&local_251);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(char *)local_250,__oflag);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_278);
  poVar3 = std::operator<<((ostream *)local_230,local_278);
  java_package_abi_cxx11_(&local_298,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_298);
  java_type_imports_abi_cxx11_(&local_2b8,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
  java_thrift_imports_abi_cxx11_(&local_2d8,this);
  std::operator<<(poVar3,(string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string(local_278);
  poVar3 = (ostream *)local_230;
  generate_java_struct_definition
            (this,poVar3,tstruct,(bool)(f_struct_name.field_2._M_local_buf[0xf] & 1),false,false);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(int)poVar3);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct(t_struct* tstruct, bool is_exception) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + (tstruct->get_name()) + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_type_imports() << java_thrift_imports();

  generate_java_struct_definition(f_struct, tstruct, is_exception);
  f_struct.close();
}